

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexExpanderShader::VertexExpanderShader
          (VertexExpanderShader *this,ContextType *contextType,GeometryShaderInputType inputType,
          GeometryShaderOutputType outputType)

{
  GeometryShaderOutputType outputType_;
  GeometryShaderInputType inputType_;
  ShaderProgramDeclaration *pSVar1;
  size_t numOutputVertices_;
  string local_318;
  GeometrySource local_2f8;
  GeometryShaderDeclaration local_2d8;
  allocator<char> local_2b9;
  string local_2b8;
  string local_298;
  FragmentSource local_278;
  allocator<char> local_251;
  string local_250;
  string local_230;
  VertexSource local_210;
  FragmentOutput local_1f0;
  GeometryToFragmentVarying local_1ec;
  VertexToGeometryVarying local_1e4;
  allocator<char> local_1d9;
  string local_1d8;
  VertexAttribute local_1b8;
  allocator<char> local_179;
  string local_178;
  VertexAttribute local_158;
  ShaderProgramDeclaration local_130;
  GeometryShaderOutputType local_20;
  GeometryShaderInputType local_1c;
  GeometryShaderOutputType outputType_local;
  GeometryShaderInputType inputType_local;
  ContextType *contextType_local;
  VertexExpanderShader *this_local;
  
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_032bdb38;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_032bdb70;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_032bdb88;
  local_20 = outputType;
  local_1c = inputType;
  _outputType_local = contextType;
  contextType_local = (ContextType *)this;
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_130);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_178,"a_position",&local_179);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_158,&local_178,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_130,&local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d8,"a_color",&local_1d9);
  sglr::pdec::VertexAttribute::VertexAttribute(&local_1b8,&local_1d8,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1b8);
  sglr::pdec::VertexToGeometryVarying::VertexToGeometryVarying(&local_1e4,GENERICVECTYPE_FLOAT,0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1e4);
  sglr::pdec::GeometryToFragmentVarying::GeometryToFragmentVarying
            (&local_1ec,GENERICVECTYPE_FLOAT,0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1ec);
  sglr::pdec::FragmentOutput::FragmentOutput(&local_1f0,GENERICVECTYPE_FLOAT);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_color;\nout highp vec4 v_geom_FragColor;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tgl_PointSize = 1.0;\n\tv_geom_FragColor = a_color;\n}\n"
             ,&local_251);
  specializeShader(&local_230,&local_250,_outputType_local);
  sglr::pdec::VertexSource::VertexSource(&local_210,&local_230);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_210);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2b8,
             "${GLSL_VERSION_DECL}\nlayout(location = 0) out mediump vec4 fragColor;\nin mediump vec4 v_frag_FragColor;\nvoid main (void)\n{\n\tfragColor = v_frag_FragColor;\n}\n"
             ,&local_2b9);
  specializeShader(&local_298,&local_2b8,_outputType_local);
  sglr::pdec::FragmentSource::FragmentSource(&local_278,&local_298);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_278);
  inputType_ = local_1c;
  outputType_ = local_20;
  numOutputVertices_ = calcOutputVertices(this,local_1c);
  sglr::pdec::GeometryShaderDeclaration::GeometryShaderDeclaration
            (&local_2d8,inputType_,outputType_,numOutputVertices_,1);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_2d8);
  Functional::(anonymous_namespace)::VertexExpanderShader::genGeometrySource_abi_cxx11_
            (&local_318,(VertexExpanderShader *)this,_outputType_local,local_1c,local_20);
  sglr::pdec::GeometrySource::GeometrySource(&local_2f8,&local_318);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_2f8);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar1);
  sglr::pdec::GeometrySource::~GeometrySource(&local_2f8);
  std::__cxx11::string::~string((string *)&local_318);
  sglr::pdec::FragmentSource::~FragmentSource(&local_278);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  sglr::pdec::VertexSource::~VertexSource(&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_1b8);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::allocator<char>::~allocator(&local_1d9);
  sglr::pdec::VertexAttribute::~VertexAttribute(&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_130);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_032bdb38;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_032bdb70;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_032bdb88;
  return;
}

Assistant:

VertexExpanderShader::VertexExpanderShader (const glu::ContextType& contextType, rr::GeometryShaderInputType inputType, rr::GeometryShaderOutputType outputType)
	: sglr::ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexAttribute("a_color", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexToGeometryVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::GeometryToFragmentVarying(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::VertexSource(specializeShader(s_commonShaderSourceVertex, contextType))
							<< sglr::pdec::FragmentSource(specializeShader(s_commonShaderSourceFragment, contextType))
							<< sglr::pdec::GeometryShaderDeclaration(inputType, outputType, calcOutputVertices(inputType))
							<< sglr::pdec::GeometrySource(genGeometrySource(contextType, inputType, outputType)))
{
}